

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::transformed_vertex0(Fl_Graphics_Driver *this,COORD_T x,COORD_T y)

{
  XPoint *pXVar1;
  int local_24;
  COORD_T y_local;
  COORD_T x_local;
  Fl_Graphics_Driver *this_local;
  
  if (((this->n == 0) || (x != this->p[this->n + -1].x)) || (y != this->p[this->n + -1].y)) {
    if (this->p_size <= this->n) {
      if (this->p == (XPoint *)0x0) {
        local_24 = 0x10;
      }
      else {
        local_24 = this->p_size << 1;
      }
      this->p_size = local_24;
      pXVar1 = (XPoint *)realloc(this->p,(long)this->p_size << 2);
      this->p = pXVar1;
    }
    this->p[this->n].x = x;
    this->p[this->n].y = y;
    this->n = this->n + 1;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::transformed_vertex0(COORD_T x, COORD_T y) {
  if (!n || x != p[n-1].x || y != p[n-1].y) {
    if (n >= p_size) {
      p_size = p ? 2*p_size : 16;
      p = (XPOINT*)realloc((void*)p, p_size*sizeof(*p));
    }
    p[n].x = x;
    p[n].y = y;
    n++;
  }
}